

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O3

void start_checkpoint(storage_t *st)

{
  __atomic_base<unsigned_long> __s2;
  fdb_status fVar1;
  int iVar2;
  checkpoint_t *pcVar3;
  size_t sVar4;
  __atomic_base<unsigned_long> _Var5;
  _func_voidref_void_ptr_bid_t_ptr *p_Var6;
  _func_voidref_void_ptr_bid_t_size_t_bid_t_ptr *p_Var7;
  list_elem *ptr_handle;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *markers_out;
  filemgr *unaff_RBP;
  undefined4 uVar8;
  fdb_doc *pfVar9;
  checkpoint_t *handle_in;
  char *pcVar10;
  fdb_kvs_handle *pfVar11;
  fdb_kvs_handle *pfVar12;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 fhandle;
  char *unaff_R12;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar13;
  fdb_doc **unaff_R13;
  long lVar14;
  list *plVar15;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar16;
  timeval __test_begin;
  fdb_snapshot_info_t *pfStackY_3a8;
  uint64_t uStackY_3a0;
  list_elem *plStackY_398;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStackY_390;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStackY_388;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStackY_378;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStackY_370;
  timeval tStackY_368;
  checkpoint_t *pcStackY_358;
  fdb_doc *pfStackY_350;
  fdb_doc **ppfStackY_348;
  fdb_kvs_handle *pfStackY_340;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStackY_338;
  filemgr *pfStackY_330;
  fdb_doc *pfStack_318;
  fdb_iterator *pfStack_310;
  list_elem lStack_308;
  idx_prams_t iStack_2f8;
  timeval tStack_2e0;
  fdb_kvs_handle *pfStack_2d0;
  fdb_doc *pfStack_2c8;
  fdb_doc **ppfStack_2c0;
  checkpoint_t *pcStack_2b8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2b0;
  filemgr *pfStack_2a8;
  fdb_doc *pfStack_298;
  timeval tStack_290;
  undefined1 auStack_280 [48];
  char acStack_250 [264];
  fdb_kvs_handle *pfStack_148;
  checkpoint_t *pcStack_140;
  fdb_doc *pfStack_130;
  timeval tStack_128;
  atomic<unsigned_long> aStack_118;
  fdb_kvs_handle *pfStack_110;
  atomic<unsigned_long> aStack_108;
  fdb_doc *pfStack_f8;
  filemgr *pfStack_f0;
  fdb_doc *pfStack_e8;
  fdb_iterator *pfStack_e0;
  char acStack_d4 [4];
  fdb_kvs_handle *pfStack_d0;
  fdb_kvs_handle *pfStack_c8;
  fdb_kvs_handle *pfStack_c0;
  fdb_doc *pfStack_b8;
  size_t sStack_b0;
  timeval tStack_a8;
  fdb_kvs_info fStack_98;
  storage_t *psStack_68;
  fdb_doc *local_30;
  timeval local_28;
  
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  local_30 = (fdb_doc *)0x0;
  pfVar11 = (fdb_kvs_handle *)st->records;
  uVar8._0_1_ = '\x02';
  uVar8._1_1_ = '\0';
  uVar8._2_1_ = '\0';
  uVar8._3_1_ = '\0';
  fVar1 = fdb_begin_transaction((fdb_file_handle *)pfVar11,'\x02');
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcVar3 = create_checkpoint(st,5);
    sVar4 = strlen(pcVar3->key);
    fdb_doc_create(&local_30,pcVar3,sVar4,(void *)0x0,0,pcVar3,0x430);
    save_tx(st,local_30->key,local_30->keylen,5);
    pfVar11 = st->chk;
    pfVar9 = local_30;
    fVar1 = fdb_set(pfVar11,local_30);
    uVar8 = SUB84(pfVar9,0);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      free(pcVar3);
      fdb_doc_free(local_30);
      return;
    }
  }
  else {
    start_checkpoint_cold_1();
  }
  start_checkpoint_cold_2();
  aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1099d7;
  acStack_d4 = (char  [4])uVar8;
  psStack_68 = st;
  gettimeofday(&tStack_a8,(__timezone_ptr_t)0x0);
  pfStack_f8 = (fdb_doc *)0x0;
  __s2._M_i = (__int_type)(pfVar11->field_6).seqtree;
  pfStack_f0 = (filemgr *)0x0;
  aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1099f4;
  _Var5._M_i = (__int_type)calloc(1,0x430);
  pfVar12 = (fdb_kvs_handle *)pfVar11->trie;
  aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a05;
  fVar1 = fdb_get_kvs_info(pfVar12,&fStack_98);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_e8 = (fdb_doc *)(__s2._M_i + 0xc);
    aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a23;
    e2e_fdb_commit(*(fdb_file_handle **)&pfVar11->kvs_config,*(bool *)((long)&pfVar11->file + 6));
    aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a32;
    p_Var6 = (_func_voidref_void_ptr_bid_t_ptr *)
             last_snap_seqnum((storage_t *)pfVar11,"e2ekv_alldocs");
    ((btree_blk_ops *)(_Var5._M_i + 0x410))->blk_alloc = p_Var6;
    aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a48;
    p_Var6 = (_func_voidref_void_ptr_bid_t_ptr *)
             last_snap_seqnum((storage_t *)pfVar11,"e2ekv_index1");
    *(_func_voidref_void_ptr_bid_t_ptr **)(_Var5._M_i + 0x418) = p_Var6;
    aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a5e;
    p_Var7 = (_func_voidref_void_ptr_bid_t_size_t_bid_t_ptr *)
             last_snap_seqnum((storage_t *)pfVar11,"e2ekv_index2");
    *(_func_voidref_void_ptr_bid_t_size_t_bid_t_ptr **)(_Var5._M_i + 0x420) = p_Var7;
    lVar14 = 0;
    unaff_RBP = (filemgr *)0x8421084210842109;
    unaff_R12 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";
    do {
      aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a7e;
      iVar2 = rand();
      *(char *)(_Var5._M_i + lVar14) =
           "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
           [(ulong)(long)iVar2 % 0x3e];
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0xc);
    *(undefined1 *)(_Var5._M_i + 0xb) = 0;
    *(undefined4 *)(_Var5._M_i + 0x400) = (undefined4)fStack_98.doc_count;
    *(undefined2 *)(_Var5._M_i + 0x40c) = 0;
    *(short *)(_Var5._M_i + 0x428) = acStack_d4._0_2_;
    pfVar12 = (fdb_kvs_handle *)(pfVar11->kvs_config).custom_cmp;
    aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109ae6;
    fVar1 = fdb_snapshot_open(pfVar12,&pfStack_d0,
                              (fdb_seqnum_t)((btree_blk_ops *)(_Var5._M_i + 0x410))->blk_alloc);
    unaff_R13 = (fdb_doc **)0xc;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00109cc9;
    pfVar12 = (fdb_kvs_handle *)(pfVar11->kvs_config).custom_cmp_param;
    aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109b03;
    fVar1 = fdb_snapshot_open(pfVar12,&pfStack_c0,
                              (fdb_seqnum_t)
                              *(_func_voidref_void_ptr_bid_t_ptr **)(_Var5._M_i + 0x418));
    unaff_R12 = (char *)pfStack_e8;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00109cce;
    pfVar12 = (fdb_kvs_handle *)pfVar11->kvs;
    aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109b25;
    fVar1 = fdb_snapshot_open(pfVar12,&pfStack_c8,
                              (fdb_seqnum_t)
                              *(_func_voidref_void_ptr_bid_t_size_t_bid_t_ptr **)
                               (_Var5._M_i + 0x420));
    if (fVar1 == FDB_RESULT_SUCCESS) {
      aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109b54;
      fVar1 = fdb_iterator_init(pfStack_c0,&pfStack_e0,(void *)__s2._M_i,0xc,unaff_R12,0xc,2);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pfVar11 = (fdb_kvs_handle *)&pfVar11->file;
        unaff_R13 = &pfStack_f8;
        do {
          aStack_108.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)0x109b75;
          fVar1 = fdb_iterator_get(pfStack_e0,unaff_R13);
          unaff_R12 = (char *)pfStack_f8;
          if (fVar1 == FDB_RESULT_SUCCESS) {
            pcVar10 = (char *)pfStack_f8->key;
            aStack_108.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)0x109b92;
            iVar2 = strcmp(pcVar10,(char *)__s2._M_i);
            if (iVar2 < 0) {
LAB_00109c55:
              aStack_108.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109c6a;
              create_checkpoint_cold_5();
              unaff_R12 = (char *)pfStack_b8;
            }
            else {
              aStack_108.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109ba7;
              iVar2 = strcmp(pcVar10,(char *)pfStack_e8);
              if (0 < iVar2) goto LAB_00109c55;
            }
            aStack_108.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)0x109bcd;
            fVar1 = fdb_get_kv(pfStack_d0,((fdb_doc *)unaff_R12)->body,
                               ((fdb_doc *)unaff_R12)->bodylen,&pfStack_f0,&sStack_b0);
            unaff_RBP = pfStack_f0;
            if (fVar1 == FDB_RESULT_SUCCESS) {
              aStack_108.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109be5;
              iVar2 = strcmp((char *)(pfStack_f0[4].encryption.key.bytes + 4),(char *)pfVar11);
              if (iVar2 == 0) {
                *(int *)(_Var5._M_i + 0x404) = *(int *)(_Var5._M_i + 0x404) + 1;
                aStack_108.super___atomic_base<unsigned_long>._M_i =
                     (__atomic_base<unsigned_long>)0x109bfe;
                pfVar12 = pfStack_c8;
                fVar1 = fdb_get(pfStack_c8,pfStack_f8);
                if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00109cd8;
                *(int *)(_Var5._M_i + 0x408) = *(int *)(_Var5._M_i + 0x408) + *pfStack_f8->body;
                unaff_RBP = pfStack_f0;
              }
              aStack_108.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109c24;
              free(unaff_RBP);
              pfStack_f0 = (filemgr *)0x0;
            }
            aStack_108.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)0x109c37;
            fdb_doc_free(pfStack_f8);
            pfStack_f8 = (fdb_doc *)0x0;
          }
          aStack_108.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)0x109c4a;
          fVar1 = fdb_iterator_next(pfStack_e0);
          pfVar9 = pfStack_f8;
        } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
      }
      else {
        pfVar9 = (fdb_doc *)0x0;
      }
      aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109c7e;
      fdb_doc_free(pfVar9);
      pfStack_f8 = (fdb_doc *)0x0;
      aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109c91;
      fdb_iterator_close(pfStack_e0);
      aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109c9b;
      fdb_kvs_close(pfStack_d0);
      aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109ca5;
      fdb_kvs_close(pfStack_c0);
      aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109caf;
      fdb_kvs_close(pfStack_c8);
      return;
    }
  }
  else {
    aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109cc9;
    create_checkpoint_cold_1();
LAB_00109cc9:
    aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109cce;
    create_checkpoint_cold_2();
LAB_00109cce:
    aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109cd3;
    create_checkpoint_cold_3();
  }
  aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109cd8;
  create_checkpoint_cold_4();
LAB_00109cd8:
  aStack_108.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)end_checkpoint;
  create_checkpoint_cold_6();
  pcStack_140 = (checkpoint_t *)0x109cf5;
  aStack_118.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
  pfStack_110 = pfVar11;
  aStack_108.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)__s2._M_i;
  gettimeofday(&tStack_128,(__timezone_ptr_t)0x0);
  pfStack_130 = (fdb_doc *)0x0;
  pcStack_140 = (checkpoint_t *)0x109d0e;
  pcVar3 = create_checkpoint((storage_t *)pfVar12,6);
  pcStack_140 = (checkpoint_t *)0x109d19;
  sVar4 = strlen(pcVar3->key);
  pcStack_140 = (checkpoint_t *)0x109d37;
  fdb_doc_create(&pfStack_130,pcVar3,sVar4,(void *)0x0,0,pcVar3,0x430);
  pcStack_140 = (checkpoint_t *)0x109d4e;
  save_tx((storage_t *)pfVar12,pfStack_130->key,pfStack_130->keylen,6);
  pfVar11 = (fdb_kvs_handle *)pfVar12->op_stats;
  pcStack_140 = (checkpoint_t *)0x109d5b;
  fVar1 = fdb_end_transaction((fdb_file_handle *)pfVar11,
                              *(fdb_commit_opt_t *)((long)&pfVar12->file + 6));
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfVar11 = (fdb_kvs_handle *)pfVar12->trie;
    pcStack_140 = (checkpoint_t *)0x109d6d;
    fVar1 = fdb_set(pfVar11,pfStack_130);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStack_140 = (checkpoint_t *)0x109d79;
      free(pcVar3);
      pcStack_140 = (checkpoint_t *)0x109d83;
      fdb_doc_free(pfStack_130);
      return;
    }
  }
  else {
    pcStack_140 = (checkpoint_t *)0x109d92;
    end_checkpoint_cold_1();
  }
  pcStack_140 = (checkpoint_t *)e2e_fdb_cancel_checkpoint;
  end_checkpoint_cold_2();
  pfStack_2a8 = (filemgr *)0x109db0;
  pfStack_148 = pfVar12;
  pcStack_140 = pcVar3;
  gettimeofday(&tStack_290,(__timezone_ptr_t)0x0);
  pfStack_298 = (fdb_doc *)0x0;
  pfVar12 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)&pfVar11->trie)->super___atomic_base<unsigned_long>)._M_i;
  handle_in = (checkpoint_t *)auStack_280;
  pfStack_2a8 = (filemgr *)0x109dc7;
  fVar1 = fdb_get_kvs_info(pfVar12,(fdb_kvs_info *)handle_in);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfVar12 = (fdb_kvs_handle *)&pfStack_298;
    handle_in = (checkpoint_t *)0x0;
    pfStack_2a8 = (filemgr *)0x109ded;
    fVar1 = fdb_doc_create((fdb_doc **)pfVar12,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00109eec;
    pfStack_298->seqnum = auStack_280._8_8_;
    pfStack_2a8 = (filemgr *)0x109e0c;
    fdb_get_byseq((fdb_kvs_handle *)
                  (((atomic<unsigned_long> *)&pfVar11->trie)->super___atomic_base<unsigned_long>).
                  _M_i,pfStack_298);
    pcVar3 = (checkpoint_t *)pfStack_298->body;
    if (pcVar3->type != 5) {
      pfStack_2a8 = (filemgr *)0x109e2c;
      e2e_fdb_cancel_checkpoint_cold_3();
    }
    pfVar12 = (fdb_kvs_handle *)&(pfVar11->kvs_config).custom_cmp;
    handle_in = (checkpoint_t *)pcVar3->seqnum_all;
    pfStack_2a8 = (filemgr *)0x109e3c;
    fVar1 = fdb_rollback((fdb_kvs_handle **)pfVar12,(fdb_seqnum_t)handle_in);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00109ef1;
    pfVar12 = (fdb_kvs_handle *)&(pfVar11->kvs_config).custom_cmp_param;
    handle_in = (checkpoint_t *)pcVar3->seqnum_idx1;
    pfStack_2a8 = (filemgr *)0x109e54;
    fVar1 = fdb_rollback((fdb_kvs_handle **)pfVar12,(fdb_seqnum_t)handle_in);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00109ef6;
    pfVar12 = (fdb_kvs_handle *)&pfVar11->kvs;
    handle_in = (checkpoint_t *)pcVar3->seqnum_idx2;
    pfStack_2a8 = (filemgr *)0x109e6c;
    fVar1 = fdb_rollback((fdb_kvs_handle **)pfVar12,(fdb_seqnum_t)handle_in);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00109efb;
    pfStack_2a8 = (filemgr *)0x109e85;
    handle_in = pcVar3;
    memcpy(pfVar11->staletree,pcVar3,0x430);
    pfVar12 = (fdb_kvs_handle *)
              (((atomic<unsigned_long> *)&pfVar11->op_stats)->super___atomic_base<unsigned_long>).
              _M_i;
    pfStack_2a8 = (filemgr *)0x109e8e;
    fVar1 = fdb_abort_transaction((fdb_file_handle *)pfVar12);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_2a8 = (filemgr *)0x109eaf;
      sprintf(auStack_280 + 0x30,"revert to checkpoint[seqno:%lu]\n",pcVar3->seqnum_all);
      pcVar10 = "%s PASSED\n";
      if (e2e_fdb_cancel_checkpoint::__test_pass != '\0') {
        pcVar10 = "%s FAILED\n";
      }
      pfStack_2a8 = (filemgr *)0x109edc;
      fprintf(_stderr,pcVar10,auStack_280 + 0x30);
      return;
    }
  }
  else {
    pfStack_2a8 = (filemgr *)0x109eec;
    e2e_fdb_cancel_checkpoint_cold_1();
LAB_00109eec:
    pfStack_2a8 = (filemgr *)0x109ef1;
    e2e_fdb_cancel_checkpoint_cold_2();
LAB_00109ef1:
    pfStack_2a8 = (filemgr *)0x109ef6;
    e2e_fdb_cancel_checkpoint_cold_4();
LAB_00109ef6:
    pfStack_2a8 = (filemgr *)0x109efb;
    e2e_fdb_cancel_checkpoint_cold_5();
LAB_00109efb:
    pfStack_2a8 = (filemgr *)0x109f00;
    e2e_fdb_cancel_checkpoint_cold_6();
  }
  pfStack_2a8 = (filemgr *)scan;
  e2e_fdb_cancel_checkpoint_cold_7();
  pfStackY_330 = (filemgr *)0x109f25;
  pfStack_2d0 = pfVar11;
  pfStack_2c8 = (fdb_doc *)unaff_R12;
  ppfStack_2c0 = unaff_R13;
  pcStack_2b8 = pcVar3;
  aStack_2b0.seqtree = (btree *)&pfStack_130;
  pfStack_2a8 = unaff_RBP;
  gettimeofday(&tStack_2e0,(__timezone_ptr_t)0x0);
  pfStack_318 = (fdb_doc *)0x0;
  pfStackY_330 = (filemgr *)0x109f38;
  gen_index_params(&iStack_2f8);
  if (handle_in != (checkpoint_t *)0x0) {
    pfStackY_330 = (filemgr *)0x109f51;
    fVar1 = fdb_snapshot_open((fdb_kvs_handle *)handle_in,(fdb_kvs_handle **)&lStack_308,
                              0xffffffffffffffff);
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00109f77;
    pfStackY_330 = (filemgr *)0x109f5a;
    scan_cold_1();
  }
  paVar13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(pfVar12->kvs_config).custom_cmp_param;
  ptr_handle = &lStack_308;
  pfStackY_330 = (filemgr *)0x109f6f;
  fVar1 = fdb_snapshot_open((fdb_kvs_handle *)paVar13,(fdb_kvs_handle **)ptr_handle,
                            0xffffffffffffffff);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pfStackY_330 = (filemgr *)last_snap_seqnum;
    scan_cold_2();
    aStackY_388 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x10a070;
    pcStackY_358 = handle_in;
    pfStackY_350 = (fdb_doc *)unaff_R12;
    ppfStackY_348 = unaff_R13;
    pfStackY_340 = pfVar12;
    aStackY_338.seqtree = (btree *)&pfStack_130;
    pfStackY_330 = unaff_RBP;
    gettimeofday(&tStackY_368,(__timezone_ptr_t)0x0);
    fhandle = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)paVar13->seqtree;
    markers_out = &aStackY_378;
    aStackY_388 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x10a082;
    fVar1 = fdb_get_all_snap_markers
                      ((fdb_file_handle *)fhandle.seqtree,
                       (fdb_snapshot_info_t **)&markers_out->seqtree,(uint64_t *)&paStackY_370);
    paStackY_390 = paVar13;
    aVar16.seqtree = (btree *)&pfStack_130;
    if (fVar1 == FDB_RESULT_SUCCESS) {
      if (paStackY_370 != (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0) {
        paVar13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
        do {
          plVar15 = (list *)(&(aStackY_378.seqtree)->root_bid)[(long)paVar13 * 3];
          if (0 < (long)plVar15) {
            unaff_RBP = (filemgr *)
                        &((list *)(&(aStackY_378.seqtree)->blk_handle)[(long)paVar13 * 3])->tail;
            do {
              aStackY_388 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x10a0c2;
              iVar2 = strcmp(*(char **)&unaff_RBP[-1].fhandle_idx_lock,(char *)ptr_handle);
              if (iVar2 == 0) goto LAB_0010a0eb;
              unaff_RBP = (filemgr *)&unaff_RBP->blocksize;
              plVar15 = (list *)((long)&plVar15[-1].tail + 7);
            } while (plVar15 != (list *)0x0);
          }
          paVar13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)paVar13 + 1);
        } while (paVar13 != paStackY_370);
      }
      aStackY_388 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x10a0e2;
      markers_out = paStackY_370;
      fhandle = aStackY_378;
      fVar1 = fdb_free_snap_markers
                        ((fdb_snapshot_info_t *)aStackY_378.seqtree,(uint64_t)paStackY_370);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        aStackY_388 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x10a0eb;
        last_snap_seqnum();
LAB_0010a0eb:
        ptr_handle = (list_elem *)unaff_RBP->filename;
        aStackY_388 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x10a0fa;
        markers_out = paStackY_370;
        fhandle = aStackY_378;
        fVar1 = fdb_free_snap_markers
                          ((fdb_snapshot_info_t *)aStackY_378.seqtree,(uint64_t)paStackY_370);
        if (fVar1 == FDB_RESULT_SUCCESS) {
          return;
        }
      }
      aStackY_388 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x10a115;
      last_snap_seqnum();
      paStackY_390 = paStackY_370;
      aVar16 = aStackY_378;
    }
    aStackY_388.seqtree = (btree *)print_n_markers;
    last_snap_seqnum();
    plStackY_398 = ptr_handle;
    aStackY_388 = aVar16;
    fdb_get_all_snap_markers
              ((fdb_file_handle *)*(fdb_kvs_handle **)&(fhandle.seqtree)->ksize,&pfStackY_3a8,
               &uStackY_3a0);
    if (markers_out != (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0) {
      lVar14 = 0x10;
      do {
        printf("marker:  %lu\n",*(undefined8 *)(*(long *)((long)&pfStackY_3a8->marker + lVar14) + 8)
              );
        lVar14 = lVar14 + 0x18;
        markers_out = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)markers_out + -1);
      } while (markers_out != (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0);
    }
    return;
  }
LAB_00109f77:
  pfStackY_330 = (filemgr *)0x109fa5;
  fVar1 = fdb_iterator_init((fdb_kvs_handle *)lStack_308.prev,&pfStack_310,&iStack_2f8,0xc,
                            iStack_2f8.max,0xc,0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    do {
      pfStackY_330 = (filemgr *)0x109fe3;
      fVar1 = fdb_iterator_get(pfStack_310,&pfStack_318);
      pfVar9 = pfStack_318;
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcVar10 = (char *)pfStack_318->key;
        pfStackY_330 = (filemgr *)0x109ffb;
        iVar2 = strcmp(pcVar10,iStack_2f8.min);
        if (iVar2 < 0) {
LAB_0010a033:
          pfStackY_330 = (filemgr *)0x10a044;
          scan_cold_3();
          pfVar9 = (fdb_doc *)lStack_308.next;
        }
        else {
          pfStackY_330 = (filemgr *)0x10a00a;
          iVar2 = strcmp(pcVar10,iStack_2f8.max);
          if (0 < iVar2) goto LAB_0010a033;
        }
        pfStackY_330 = (filemgr *)0x10a016;
        fdb_doc_free(pfVar9);
        pfStack_318 = (fdb_doc *)0x0;
      }
      pfStackY_330 = (filemgr *)0x10a029;
      fVar1 = fdb_iterator_next(pfStack_310);
    } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
  }
  pfStackY_330 = (filemgr *)0x109fb3;
  fdb_iterator_close(pfStack_310);
  return;
}

Assistant:

void start_checkpoint(storage_t *st)
{
    TEST_INIT();

    checkpoint_t *chk;
    fdb_status status;
    fdb_doc *chk_doc = NULL;

    status = fdb_begin_transaction(st->records, FDB_ISOLATION_READ_COMMITTED);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // create opening checkpoint doc
    chk = create_checkpoint(st, START_CHECKPOINT);
    fdb_doc_create(&chk_doc, chk->key, strlen(chk->key),
                   NULL, 0, chk, sizeof(checkpoint_t));

    // save checkpoint transaction
    save_tx(st, chk_doc->key, chk_doc->keylen, START_CHECKPOINT);
    status = fdb_set(st->chk, chk_doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);


#ifdef __DEBUG_E2E
    char rbuf[256];
    sprintf(rbuf, "start checkpoint[seqno:%" _F64 "]",chk->seqnum_all);
    TEST_RESULT(rbuf);
#endif

    free(chk);
    fdb_doc_free(chk_doc);
    chk_doc=NULL;
    chk=NULL;


}